

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcast_unsigned_converters.hpp
# Opt level: O2

bool __thiscall
boost::detail::lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char>::
main_convert_iteration(lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  bVar3 = (bool)(0x19999999 < this->m_multiplier | this->m_multiplier_overflowed);
  this->m_multiplier_overflowed = bVar3;
  uVar5 = this->m_multiplier * 10;
  this->m_multiplier = uVar5;
  if (0xf5 < (byte)(*this->m_end - 0x3aU)) {
    uVar1 = (int)*this->m_end - 0x30;
    if (uVar1 == 0) {
      puVar2 = this->m_value;
      uVar4 = *puVar2;
LAB_001afdc1:
      *puVar2 = uVar4 + uVar1 * uVar5;
      return true;
    }
    if ((bVar3 == false) && ((int)((ulong)uVar1 * (ulong)uVar5 >> 0x20) == 0)) {
      puVar2 = this->m_value;
      uVar4 = *puVar2;
      if (!CARRY4(uVar1 * uVar5,uVar4)) goto LAB_001afdc1;
    }
  }
  return false;
}

Assistant:

inline bool main_convert_iteration() BOOST_NOEXCEPT {
                CharT const czero = lcast_char_constants<CharT>::zero;
                T const maxv = (std::numeric_limits<T>::max)();

                m_multiplier_overflowed = m_multiplier_overflowed || (maxv/10 < m_multiplier);
                m_multiplier = static_cast<T>(m_multiplier * 10);

                T const dig_value = static_cast<T>(*m_end - czero);
                T const new_sub_value = static_cast<T>(m_multiplier * dig_value);

                // We must correctly handle situations like `000000000000000000000000000001`.
                // So we take care of overflow only if `dig_value` is not '0'.
                if (*m_end < czero || *m_end >= czero + 10  // checking for correct digit
                    || (dig_value && (                      // checking for overflow of ... 
                        m_multiplier_overflowed                             // ... multiplier
                        || static_cast<T>(maxv / dig_value) < m_multiplier  // ... subvalue
                        || static_cast<T>(maxv - new_sub_value) < m_value   // ... whole expression
                    ))
                ) return false;

                m_value = static_cast<T>(m_value + new_sub_value);
                
                return true;
            }